

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall deqp::egl::GLES2ThreadTest::AttachShader::exec(AttachShader *this,Thread *t)

{
  GLuint GVar1;
  code *pcVar2;
  deUint32 err;
  deBool dVar3;
  MessageBuilder *pMVar4;
  Program *pPVar5;
  Shader *pSVar6;
  MessageBuilder local_350;
  MessageBuilder local_1b0;
  Thread *local_20;
  EGLThread *thread;
  Thread *t_local;
  AttachShader *this_local;
  
  thread = (EGLThread *)t;
  t_local = (Thread *)this;
  local_20 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (local_20 != (Thread *)0x0) {
    tcu::ThreadUtil::Thread::newMessage(&local_1b0,local_20);
    pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                       (&local_1b0,(char (*) [25])"Begin -- glAttachShader(");
    pPVar5 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::operator->(&this->m_program);
    pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&pPVar5->program);
    pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x584b6d);
    pSVar6 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::operator->(&this->m_shader);
    pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&pSVar6->shader);
    pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x5b492c);
    tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
    tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_1b0);
    do {
      pcVar2 = *(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x10);
      pPVar5 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::operator->(&this->m_program);
      GVar1 = pPVar5->program;
      pSVar6 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::operator->(&this->m_shader);
      (*pcVar2)(GVar1,pSVar6->shader);
      err = (**(code **)(*(long *)&local_20[1].super_Thread.m_attribs + 0x800))();
      glu::checkError(err,"attachShader(m_program->program, m_shader->shader)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                      ,0x622);
      dVar3 = ::deGetFalse();
    } while (dVar3 != 0);
    tcu::ThreadUtil::Thread::newMessage(&local_350,local_20);
    pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                       (&local_350,(char (*) [24])"End -- glAttachShader()");
    tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
    tcu::ThreadUtil::MessageBuilder::~MessageBuilder(&local_350);
    pSVar6 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::operator->(&this->m_shader);
    if (pSVar6->type == 0x8b31) {
      pSVar6 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::operator->(&this->m_shader);
      GVar1 = pSVar6->shader;
      pPVar5 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::operator->(&this->m_program);
      pPVar5->runtimeVertexShader = GVar1;
    }
    else {
      pSVar6 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::operator->(&this->m_shader);
      if (pSVar6->type == 0x8b30) {
        pSVar6 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Shader>::operator->(&this->m_shader);
        GVar1 = pSVar6->shader;
        pPVar5 = de::SharedPtr<deqp::egl::GLES2ThreadTest::Program>::operator->(&this->m_program);
        pPVar5->runtimeFragmentShader = GVar1;
      }
    }
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void AttachShader::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);

	thread.newMessage() << "Begin -- glAttachShader(" << m_program->program << ", " << m_shader->shader << ")" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, attachShader(m_program->program, m_shader->shader));
	thread.newMessage() << "End -- glAttachShader()" << tcu::ThreadUtil::Message::End;

	if (m_shader->type == GL_VERTEX_SHADER)
		m_program->runtimeVertexShader = m_shader->shader;
	else if (m_shader->type == GL_FRAGMENT_SHADER)
		m_program->runtimeFragmentShader = m_shader->shader;
	else
		DE_ASSERT(false);
}